

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StructNew * __thiscall
wasm::Builder::makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Type local_30;
  StructNew *local_28;
  StructNew *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (StructNew *)args;
  args_local = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this;
  this_local = (Builder *)type.id;
  local_28 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             &local_28->operands,
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)ret);
  wasm::Type::Type(&local_30,(HeapType)this_local,NonNullable);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id =
       local_30.id;
  StructNew::finalize(local_28);
  return local_28;
}

Assistant:

StructNew* makeStructNew(HeapType type, const T& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }